

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O3

void __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_int>::getBestBFromData
          (FastPForImpl<8U,_unsigned_int> *this,uint *in,uint8_t *bestb,uint8_t *bestcexcept,
          uint8_t *maxb)

{
  byte bVar1;
  byte bVar2;
  uint32_t k;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int local_118 [68];
  
  lVar3 = 0;
  local_118[0x20] = 0;
  local_118[0x10] = 0;
  local_118[0x11] = 0;
  local_118[0x12] = 0;
  local_118[0x13] = 0;
  local_118[0x14] = 0;
  local_118[0x15] = 0;
  local_118[0x16] = 0;
  local_118[0x17] = 0;
  local_118[0x18] = 0;
  local_118[0x19] = 0;
  local_118[0x1a] = 0;
  local_118[0x1b] = 0;
  local_118[0x1c] = 0;
  local_118[0x1d] = 0;
  local_118[0x1e] = 0;
  local_118[0x1f] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[8] = 0;
  local_118[9] = 0;
  local_118[10] = 0;
  local_118[0xb] = 0;
  local_118[0xc] = 0;
  local_118[0xd] = 0;
  local_118[0xe] = 0;
  local_118[0xf] = 0;
  do {
    uVar6 = in[lVar3];
    if (uVar6 == 0) {
      uVar6 = 0;
    }
    else {
      iVar7 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar7 == 0; iVar7 = iVar7 + -1) {
        }
      }
      uVar6 = iVar7 + 1;
    }
    local_118[uVar6] = local_118[uVar6] + 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x100);
  bVar2 = 0x21;
  do {
    bVar2 = bVar2 - 1;
  } while (local_118[bVar2] == 0);
  *bestb = bVar2;
  *maxb = bVar2;
  bVar2 = *bestb;
  *bestcexcept = '\0';
  bVar1 = *bestb;
  if (bVar1 - 1 < 0x20) {
    uVar5 = (uint)bVar2 << 8;
    iVar9 = 0;
    iVar7 = (uint)bVar1 * 0x100 + -0xf8;
    iVar8 = 9 - (uint)bVar1;
    uVar6 = (uint)bVar1;
    do {
      iVar9 = iVar9 + local_118[uVar6];
      iVar4 = 0;
      if (*maxb == uVar6) {
        iVar4 = iVar9;
      }
      uVar10 = (((uint)*maxb + iVar8) * iVar9 - iVar4) + iVar7;
      if (uVar10 < uVar5) {
        *bestb = (char)uVar6 + 0xff;
        *bestcexcept = (uint8_t)iVar9;
        uVar5 = uVar10;
      }
      iVar7 = iVar7 + -0x100;
      iVar8 = iVar8 + 1;
      uVar10 = uVar6 - 2;
      uVar6 = uVar6 - 1;
    } while (uVar10 < 0x20);
  }
  return;
}

Assistant:

void getBestBFromData(const IntType *in, uint8_t &bestb, uint8_t &bestcexcept,
                        uint8_t &maxb) {
    uint8_t bits = sizeof(IntType) * 8;
    uint32_t freqs[65];
    for (uint32_t k = 0; k <= bits; ++k) freqs[k] = 0;
    for (uint32_t k = 0; k < BlockSize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    bestb = bits;
    while (freqs[bestb] == 0) bestb--;
    maxb = bestb;
    uint32_t bestcost = bestb * BlockSize;
    uint32_t cexcept = 0;
    bestcexcept = static_cast<uint8_t>(cexcept);
    for (uint32_t b = bestb - 1; b < bits; --b) {
      cexcept += freqs[b + 1];
      uint32_t thiscost = cexcept * overheadofeachexcept +
                          cexcept * (maxb - b) + b * BlockSize +
                          8;  // the  extra 8 is the cost of storing maxbits
      if (maxb - b == 1) thiscost -= cexcept;
      if (thiscost < bestcost) {
        bestcost = thiscost;
        bestb = static_cast<uint8_t>(b);
        bestcexcept = static_cast<uint8_t>(cexcept);
      }
    }
  }